

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O2

void __thiscall avro::Validator::doAdvance(Validator *this)

{
  pointer pCVar1;
  pointer pCVar2;
  flag_t fVar3;
  code *pcVar4;
  
  this->expectedTypesFlag_ = 0;
  fVar3 = 0;
  while( true ) {
    pCVar1 = (this->compoundStack_).
             super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->compoundStack_).
             super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((fVar3 != 0) || (pCVar1 == pCVar2)) break;
    pcVar4 = (code *)doAdvance::funcs[(long)(pCVar2[-1].node.px)->type_ * 2];
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + (long)&(this->schema_).root_.px[-1].field_0xf);
    }
    (*pcVar4)(this);
    fVar3 = this->expectedTypesFlag_;
  }
  if (pCVar1 == pCVar2) {
    this->nextType_ = AVRO_NULL;
  }
  return;
}

Assistant:

void
Validator::doAdvance()
{
    typedef void (Validator::*AdvanceFunc)();

    // only the compound types need advance functions here
    static const AdvanceFunc funcs[] = {
        0, // string
        0, // bytes
        0, // int
        0, // long
        0, // float
        0, // double
        0, // bool
        0, // null
        &Validator::countingAdvance, // Record is treated like counting with count == 1
        &Validator::enumAdvance,
        &Validator::countingAdvance,
        &Validator::countingAdvance,
        &Validator::unionAdvance,
        &Validator::fixedAdvance
    };
    BOOST_STATIC_ASSERT( (sizeof(funcs)/sizeof(AdvanceFunc)) == (AVRO_NUM_TYPES) );

    expectedTypesFlag_ = 0;
    // loop until we encounter a next expected type, or we've exited all compound types 
    while(!expectedTypesFlag_ && !compoundStack_.empty() ) {
    
        Type type = compoundStack_.back().node->type();

        AdvanceFunc func = funcs[type];

        // only compound functions are put on the status stack so it is ok to
        // assume that func is not null
        assert(func);

        ((this)->*(func))();
    }

    if(compoundStack_.empty()) {
        nextType_ = AVRO_NULL;
    }
}